

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O3

void parseGBCFile(filebuf *file)

{
  pointer paVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char buf [8];
  uint16_t local_40;
  uint16_t local_3e;
  uint16_t local_3c;
  uint16_t local_3a;
  array<Rgba,_4UL> local_38;
  
  if (options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    options.palSpec.
    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         options.palSpec.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  while( true ) {
    lVar2 = (**(code **)(*(long *)file + 0x40))(file,&local_40,8);
    if (lVar2 != 8) break;
    local_38._M_elems[0] = Rgba::fromCGBColor(local_40);
    local_38._M_elems[1] = Rgba::fromCGBColor(local_3e);
    local_38._M_elems[2] = Rgba::fromCGBColor(local_3c);
    local_38._M_elems[3] = Rgba::fromCGBColor(local_3a);
    paVar1 = options.palSpec.
             super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (options.palSpec.
        super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        options.palSpec.
        super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::array<Rgba,4ul>,std::allocator<std::array<Rgba,4ul>>>::
      _M_realloc_insert<std::array<Rgba,4ul>>
                ((vector<std::array<Rgba,4ul>,std::allocator<std::array<Rgba,4ul>>> *)
                 &options.palSpec,
                 (iterator)
                 options.palSpec.
                 super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_38);
    }
    else {
      *(ulong *)(options.palSpec.
                 super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->_M_elems =
           CONCAT44(local_38._M_elems[1],local_38._M_elems[0]);
      *(ulong *)(paVar1->_M_elems + 2) = CONCAT44(local_38._M_elems[3],local_38._M_elems[2]);
      options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           options.palSpec.
           super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if (lVar2 != 0) {
    pcVar4 = "s";
    pcVar3 = "s";
    if ((long)options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x10) {
      pcVar3 = "";
    }
    if (lVar2 == 1) {
      pcVar4 = "";
    }
    error("GBC palette dump contains %zu 8-byte palette%s, plus %zu byte%s",
          (long)options.palSpec.
                super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)options.palSpec.
                super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4,pcVar3,lVar2,pcVar4);
  }
  return;
}

Assistant:

static void parseGBCFile(std::filebuf &file) {
	// This only needs to be able to read back files generated by `rgbgfx -p`
	options.palSpec.clear();

	for (;;) {
		char buf[2 * 4];
		auto len = file.sgetn(buf, sizeof(buf));
		if (len == 0) {
			break;
		} else if (len != sizeof(buf)) {
			error("GBC palette dump contains %zu 8-byte palette%s, plus %zu byte%s",
			      options.palSpec.size(), options.palSpec.size() == 1 ? "" : "s", len,
			      len == 1 ? "" : "s");
			break;
		}

		options.palSpec.push_back({Rgba::fromCGBColor(readLE<uint16_t>(&buf[0])),
		                           Rgba::fromCGBColor(readLE<uint16_t>(&buf[2])),
		                           Rgba::fromCGBColor(readLE<uint16_t>(&buf[4])),
		                           Rgba::fromCGBColor(readLE<uint16_t>(&buf[6]))});
	}
}